

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseAssembler::comment(BaseAssembler *this,char *data,size_t size)

{
  bool bVar1;
  undefined8 in_RDX;
  BaseEmitter *in_RSI;
  char *in_RDI;
  char *in_stack_00000380;
  int in_stack_0000038c;
  char *in_stack_00000390;
  Error err;
  Error local_50;
  
  bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                    (in_RDI[9],kLogComments);
  if (bVar1) {
    if (*(long *)(in_RDI + 0x38) == 0) {
      DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
    }
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))(*(long **)(in_RDI + 0x38),in_RSI,in_RDX);
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))(*(long **)(in_RDI + 0x38),"\n",1);
    local_50 = 0;
  }
  else {
    bVar1 = Support::test<asmjit::v1_14::EmitterFlags,asmjit::v1_14::EmitterFlags>
                      (in_RDI[9],kAttached);
    err = (Error)((ulong)in_RDX >> 0x20);
    if (bVar1) {
      local_50 = 0;
    }
    else {
      DebugUtils::errored(5);
      local_50 = BaseEmitter::reportError(in_RSI,err,in_RDI);
    }
  }
  return local_50;
}

Assistant:

Error BaseAssembler::comment(const char* data, size_t size) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  // Logger cannot be NULL if `EmitterFlags::kLogComments` is set.
  ASMJIT_ASSERT(_logger != nullptr);

  _logger->log(data, size);
  _logger->log("\n", 1);
  return kErrorOk;
#else
  DebugUtils::unused(data, size);
  return kErrorOk;
#endif
}